

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::pattern_formatter::format(pattern_formatter *this,log_msg *msg,memory_buf_t *dest)

{
  bool bVar1;
  pointer pfVar2;
  __enable_if_is_duration<std::chrono::duration<long>_> in_RCX;
  string_view_t view;
  basic_string_view<char> local_98;
  reference local_88;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *f;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  *__range1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  duration<long,_std::ratio<1L,_1L>_> local_28;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  memory_buf_t *dest_local;
  log_msg *msg_local;
  pattern_formatter *this_local;
  
  secs.__r = (rep)dest;
  if ((this->need_localtime_ & 1U) != 0) {
    local_30.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch(&msg->time);
    local_28.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_30);
    bVar1 = std::chrono::operator!=(&local_28,&this->last_log_secs_);
    if (bVar1) {
      get_time_((tm *)&__range1,this,msg);
      memcpy(&this->cached_tm_,&__range1,0x38);
      (this->last_log_secs_).__r = local_28.__r;
      in_RCX.__r = local_28.__r;
    }
  }
  __end1 = std::
           vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ::begin(&this->formatters_);
  f = (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
       *)std::
         vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
         ::end(&this->formatters_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
                                     *)&f), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
               ::operator*(&__end1);
    pfVar2 = std::
             unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
             ::operator->(local_88);
    in_RCX = secs;
    (*pfVar2->_vptr_flag_formatter[2])(pfVar2,msg,&this->cached_tm_);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
    ::operator++(&__end1);
  }
  fmt::v10::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            (&local_98,&this->eol_);
  view.size_ = secs.__r;
  view.data_ = (char *)local_98.size_;
  details::fmt_helper::append_string_view
            ((fmt_helper *)local_98.data_,view,(memory_buf_t *)in_RCX.__r);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::format(const details::log_msg &msg, memory_buf_t &dest) {
    if (need_localtime_) {
        const auto secs =
            std::chrono::duration_cast<std::chrono::seconds>(msg.time.time_since_epoch());
        if (secs != last_log_secs_) {
            cached_tm_ = get_time_(msg);
            last_log_secs_ = secs;
        }
    }

    for (auto &f : formatters_) {
        f->format(msg, cached_tm_, dest);
    }
    // write eol
    details::fmt_helper::append_string_view(eol_, dest);
}